

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promp.cpp
# Opt level: O1

VectorXd __thiscall ProMP::generateTrajectory(ProMP *this,int requiredTrajLen)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  undefined8 *puVar6;
  ulong uVar7;
  char *pcVar8;
  undefined4 in_EDX;
  Index extraout_RDX;
  long lVar9;
  undefined4 in_register_00000034;
  ProMP *this_00;
  ulong uVar10;
  VectorXd VVar11;
  VectorXd sig;
  VectorXd point;
  VectorXd *gentrajReqLen;
  MatrixXd newStdW;
  MatrixXd phiT;
  VectorXd newMeanW;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  gentrajDemoLen;
  VectorXd sampleW;
  VectorXd newPhase_;
  MatrixXd phi;
  VectorXd phase1;
  Phase newPhase;
  undefined1 local_1c8 [24];
  ulong uStack_1b0;
  ProMP *local_1a8;
  double local_1a0;
  DenseStorage<double,__1,__1,__1,_0> local_198;
  DenseStorage<double,__1,__1,__1,_0> local_180;
  undefined1 local_168 [24];
  XprType local_150;
  undefined1 local_130 [32];
  void *local_110;
  DenseStorage<double,__1,__1,_1,_0> local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
  local_e8;
  MatrixXd local_88;
  undefined1 local_70 [16];
  Phase local_60;
  
  this_00 = (ProMP *)CONCAT44(in_register_00000034,requiredTrajLen);
  local_1a8 = this;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_168,
             (DenseStorage<double,__1,__1,_1,_0> *)&this_00->meanW_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_198,(DenseStorage<double,__1,__1,__1,_0> *)&this_00->stdW_);
  Phase::Phase((Phase *)(local_70 + 0x10),this_00->dt_,1.0,this_00->trajLength_);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_f8,(DenseStorage<double,__1,__1,_1,_0> *)(local_70 + 0x10));
  local_1a0 = (double)CONCAT44(local_1a0._4_4_,in_EDX);
  generateBasisFunction(&local_88,this_00,(VectorXd *)&local_f8,this_00->trajLength_);
  if ((this_00->viaPoints_).
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->viaPoints_).
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      Phase::getPhaseFromTime((Phase *)local_70,(int)local_70 + 0x10);
      generateBasisFunction((MatrixXd *)&local_180,this_00,(VectorXd *)local_70,1);
      local_1c8._0_8_ = (double *)0x0;
      local_1c8._8_8_ = 0;
      free((void *)0x0);
      pdVar5 = (double *)malloc(8);
      if (pdVar5 == (double *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_new;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_1c8._8_8_ = 1;
      *pdVar5 = *(double *)
                 ((long)&(((this_00->viaPoints_).
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data + lVar9 + 0x10);
      local_1c8._16_8_ = 0;
      uStack_1b0 = 0;
      local_1c8._0_8_ = pdVar5;
      free((void *)0x0);
      puVar6 = (undefined8 *)malloc(8);
      if (puVar6 == (undefined8 *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_new;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      uStack_1b0 = 1;
      *puVar6 = *(undefined8 *)
                 ((long)&(((this_00->viaPoints_).
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data + lVar9 + 8);
      local_1c8._16_8_ = puVar6;
      if (local_180.m_rows != local_198.m_rows) {
LAB_0010f69f:
        pcVar8 = 
        "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_0010f7a9;
      }
      if (local_198.m_cols != local_180.m_rows) {
        pcVar8 = 
        "Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_0010f7a9;
      }
      local_168._16_8_ = local_1c8;
      local_150.m_lhs.m_rhs = (RhsNested)&local_198;
      local_150.m_lhs.m_lhs.m_matrix = (non_const_type)&local_180;
      local_150.m_rhs = (RhsNested)&local_180;
      if ((local_1c8._8_8_ != 1) || (local_180.m_cols != 1)) {
        pcVar8 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>]"
        ;
        goto LAB_0010f78a;
      }
      local_130._8_8_ = local_1c8._0_8_;
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           *)(local_130 + 0x10),&local_150);
      dVar1 = *(double *)local_130._8_8_;
      dVar2 = *(double *)local_130._16_8_;
      free(local_110);
      if ((local_180.m_cols | local_198.m_rows) < 0) {
LAB_0010f6b9:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                     );
      }
      if (local_180.m_rows != local_168._8_8_) goto LAB_0010f6d8;
      if (uStack_1b0 != local_180.m_cols) {
        pcVar8 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>]"
        ;
LAB_0010f78a:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar8);
      }
      local_e8.m_rhs.m_lhs.m_lhs.m_lhs = (LhsNested)&local_198;
      local_e8.m_rhs.m_lhs.m_rhs.m_rows.m_value = local_198.m_rows;
      local_e8.m_rhs.m_lhs.m_rhs.m_cols.m_value = local_180.m_cols;
      local_e8.m_rhs.m_rhs.m_lhs = (LhsNested)(local_1c8 + 0x10);
      local_e8.m_lhs = (LhsNested)local_168;
      local_e8.m_rhs.m_lhs.m_lhs.m_rhs = (RhsNested)&local_180;
      local_e8.m_rhs.m_lhs.m_rhs.m_functor.m_other = dVar1 + dVar2;
      local_e8.m_rhs.m_rhs.m_rhs.m_lhs.m_matrix = (non_const_type)&local_180;
      local_e8.m_rhs.m_rhs.m_rhs.m_rhs = (RhsNested)local_168;
      if (local_168._8_8_ != local_198.m_rows) {
        pcVar8 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>>]"
        ;
        goto LAB_0010f78a;
      }
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_168,&local_e8,
                 (assign_op<double,_double> *)local_130,(type)0x0);
      if (local_198.m_cols != local_180.m_rows) {
        pcVar8 = 
        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_0010f7a9;
      }
      if (((local_150.m_lhs.m_lhs.m_matrix)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols < 1) {
        pcVar8 = 
        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>>, 0>::operator()(Index) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>>, Level = 0]"
        ;
        goto LAB_0010f726;
      }
      local_130._8_8_ =
           (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168._16_8_)->
           m_storage).m_data;
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           *)(local_130 + 0x10),&local_150);
      dVar1 = *(double *)local_130._8_8_;
      dVar2 = *(double *)local_130._16_8_;
      free(local_110);
      if ((local_180.m_cols | local_198.m_rows) < 0) goto LAB_0010f6b9;
      if (local_180.m_rows != local_198.m_rows) goto LAB_0010f69f;
      local_e8.m_lhs = (LhsNested)&local_198;
      local_e8.m_rhs.m_lhs.m_rhs.m_rows.m_value = local_198.m_rows;
      local_e8.m_rhs.m_lhs.m_rhs.m_cols.m_value = local_180.m_cols;
      local_e8.m_rhs.m_lhs.m_lhs.m_lhs = (LhsNested)local_e8.m_lhs;
      local_e8.m_rhs.m_lhs.m_lhs.m_rhs = (RhsNested)&local_180;
      local_e8.m_rhs.m_lhs.m_rhs.m_functor.m_other = dVar1 + dVar2;
      local_e8.m_rhs.m_rhs.m_lhs = (LhsNested)&local_180;
      local_e8.m_rhs.m_rhs.m_rhs.m_lhs.m_matrix = (non_const_type)local_e8.m_lhs;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_e8.m_lhs,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_0>_>
                  *)&local_e8,(assign_op<double,_double> *)local_130,(type)0x0);
      free((void *)local_1c8._16_8_);
      free((void *)local_1c8._0_8_);
      free(local_180.m_data);
      free((void *)local_70._0_8_);
      uVar10 = uVar10 + 1;
      uVar7 = ((long)(this_00->viaPoints_).
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->viaPoints_).
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar9 = lVar9 + 0x18;
    } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_130,
             (DenseStorage<double,__1,__1,_1,_0> *)local_168);
  iVar4 = local_1a0._0_4_;
  if (local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows ==
      local_130._8_8_) {
    local_168._16_8_ = &local_88;
    iVar3 = this_00->trajLength_;
    *(undefined8 *)local_1a8 = 0;
    local_1a8->stdBf_ = 0.0;
    local_150.m_lhs.m_lhs.m_matrix = (non_const_type)local_130;
    if (local_1a0._0_4_ < 0) {
      __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    uVar10 = (ulong)local_1a0 & 0xffffffff;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)local_1a8,uVar10,uVar10,1);
    if (iVar4 != 0) {
      local_1a0 = (double)(iVar3 + -1) / (double)iVar4;
      uVar7 = 0;
      do {
        iVar4 = (int)((double)(int)uVar7 * local_1a0);
        if ((iVar4 < 0) ||
           ((((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168._16_8_)->
            m_storage).m_cols <= (long)iVar4)) {
          pcVar8 = 
          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>, Level = 0]"
          ;
LAB_0010f726:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,pcVar8);
        }
        Eigen::internal::
        product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             *)&local_e8,(XprType *)(local_168 + 0x10));
        pdVar5 = (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                    &(local_e8.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)->m_storage).
                   m_data)[iVar4];
        free(local_e8.m_rhs.m_lhs.m_lhs.m_lhs);
        if ((long)local_1a8->stdBf_ <= (long)uVar7) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        *(double **)(*(long *)local_1a8 + uVar7 * 8) = pdVar5;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    free((void *)local_130._0_8_);
    free(local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_f8.m_data);
    free(local_60.z_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        );
    free(local_198.m_data);
    free((void *)local_168._0_8_);
    VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_1a8;
    return (VectorXd)VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    ;
  }
LAB_0010f6d8:
  pcVar8 = 
  "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
  ;
LAB_0010f7a9:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar8);
}

Assistant:

Eigen::VectorXd ProMP::generateTrajectory(int requiredTrajLen){
	double phaseSpeed = 1.0;
	auto newMeanW = meanW_;
	auto newStdW = stdW_;
	int timeSteps = (int)(trajLength_/phaseSpeed);
	Phase newPhase(dt_,phaseSpeed,timeSteps);
	auto newPhase_ = newPhase.getPhase();
	auto phi = generateBasisFunction(newPhase_,trajLength_);
	for(int i=0;i<viaPoints_.size();++i){
		auto phase1 = newPhase.getPhaseFromTime(viaPoints_[i][0]);
		auto phiT = generateBasisFunction(phase1,1);
		Eigen::VectorXd sig(1);
		sig(0) = viaPoints_[i][2];
		Eigen::VectorXd point(1);
		point(0) = viaPoints_[i][1];
		auto aux = sig + (phiT.transpose()*newStdW)*phiT;
		newMeanW = newMeanW + (newStdW*phiT/aux(0))*(point - phiT.transpose()*newMeanW);
		newStdW = newStdW - (newStdW*phiT/aux(0)) * (phiT.transpose()*newStdW);
		}
	auto sampleW = newMeanW;
	auto gentrajDemoLen =  phi.transpose()*sampleW;
	double delta = (trajLength_-1)*1.0/(requiredTrajLen);
	Eigen::VectorXd gentrajReqLen(requiredTrajLen);
	for (int i=0;i<requiredTrajLen;++i){
		gentrajReqLen(i) = gentrajDemoLen((int)(i*delta));
		}
	return gentrajReqLen;
	}